

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

string * get_graph_by_percentage_abi_cxx11_(string *__return_storage_ptr__,uint value,uint len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = (ulong)((float)len * ((float)value / 99.9));
  uVar3 = (uint)uVar4;
  if (uVar3 == 0) {
    uVar1 = 0;
  }
  else {
    uVar4 = uVar4 & 0xffffffff;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar5 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar5;
      uVar1 = uVar3;
    } while (uVar5 != 0);
  }
  if (uVar1 < len) {
    iVar2 = len - uVar3;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_graph_by_percentage( unsigned value, unsigned len ) 
{
  unsigned step = 0;
  std::string bars;

  unsigned bar_count = ( static_cast<float>(value) / 99.9 * len );

  for( ; step < bar_count; step++ )
  {
    bars.append( "|" );
  }
  for( ; step < len; step++ )
  {
    bars.append( " " );
  }

  return bars;
}